

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void read_and_smooth3D(char *path,char *stem,float sigma,float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],uchar (*inpic) [512] [512],int start,int middle,
                      int end,uchar *header)

{
  ulong uVar1;
  uchar (*paauVar2) [512] [512];
  ulong uVar3;
  long lVar4;
  float (*pafVar5) [512];
  uchar (*pauVar6) [512];
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  float sigma_00;
  
  paauVar2 = pic;
  memset(floatpic,0,0x500000);
  pic_t = (end - start) + 1;
  readfiles(path,stem,inpic,sigma_00,(int)paauVar2,&pic_x,&pic_y,start,end,header);
  iVar10 = pic_x;
  iVar9 = pic_y;
  if ((sigma == 0.0) && (!NAN(sigma))) {
    uVar1 = (ulong)(uint)pic_x;
    uVar3 = (ulong)(uint)pic_y;
    lVar4 = 0;
    do {
      if (0 < iVar10) {
        uVar7 = 0;
        pafVar5 = *floatpic;
        pauVar6 = *inpic;
        do {
          if (0 < iVar9) {
            uVar8 = 0;
            do {
              (*(float (*) [512])*pafVar5)[uVar8] = (float)(*(uchar (*) [512])*pauVar6)[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
          }
          uVar7 = uVar7 + 1;
          pauVar6 = pauVar6 + 1;
          pafVar5 = pafVar5 + 1;
        } while (uVar7 != uVar1);
      }
      lVar4 = lVar4 + 1;
      inpic = (uchar (*) [512] [512])((long)inpic + 0x40000);
      floatpic = (float (*) [512] [512])((long)floatpic + 0x100000);
    } while (lVar4 != 5);
    return;
  }
  printf("Number of columns: %d Number of rows: %d\n",(ulong)(uint)pic_y,(ulong)(uint)pic_x);
  if ((pic_x < 0x201) && (pic_y < 0x201)) {
    fflush(_stdout);
    if (OUTPUT_SMOOTH != 0) {
      printf("Start: %d End: %d Middle: %d\n",(ulong)(uint)start,(ulong)(uint)end,
             (ulong)(uint)middle);
    }
    iVar10 = middle + -3;
    iVar9 = 0;
    do {
      iVar10 = iVar10 + 1;
      convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,start,iVar10,iVar9);
      iVar9 = iVar9 + 1;
    } while (iVar10 < middle + 2);
    puts("Input files smoothed");
    return;
  }
  puts("Fatal error: images are too big");
  exit(1);
}

Assistant:

void read_and_smooth3D(char path[], char stem[],
float sigma, float floatpic[][PIC_X][PIC_Y],
 unsigned char pic[][PIC_X][PIC_Y],
unsigned char inpic[][PIC_X][PIC_Y],
int start, int middle, int end,
unsigned char header[])
{
int i,j,k,time,frame;

for(k=0;k<FIVE;k++)
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	floatpic[k][i][j] = 0.0;

pic_t = end-start+1;


readfiles(path,stem,inpic,sigma,pic_t,&pic_x,&pic_y,start,end,header);
if(sigma==0.0)
	{
	for(k=0;k<FIVE;k++)
	for(i=0;i<pic_x;i++)
	for(j=0;j<pic_y;j++)
		floatpic[k][i][j] = inpic[k][i][j];
	return;
	}

printf("Number of columns: %d Number of rows: %d\n",pic_y,pic_x);
if(pic_x > PIC_X || pic_y > PIC_Y)
	{
	printf("Fatal error: images are too big\n");
	exit(1);
	}
fflush(stdout);

time = -1;
frame = middle-2;
if(OUTPUT_SMOOTH) printf("Start: %d End: %d Middle: %d\n",start,end,middle);
for(frame=middle-2;frame<=middle+2;frame++)
	{
	time++;
	convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,
		start,middle-2+time,time);
	}
printf("Input files smoothed\n");
}